

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O0

CatalogEntryLookup *
duckdb::Catalog::TryLookupEntry
          (CatalogEntryRetriever *retriever,string *catalog,string *schema,
          EntryLookupInfo *lookup_info,OnEntryNotFound if_not_found)

{
  bool bVar1;
  CatalogType CVar2;
  int iVar3;
  Catalog *pCVar4;
  CatalogEntryLookup *in_RDI;
  EntryLookupInfo *in_R8;
  char in_R9B;
  CatalogEntryLookup lookup_result;
  CatalogLookup *lookup;
  iterator __end1_1;
  iterator __begin1_1;
  vector<duckdb::CatalogLookup,_true> *__range1_1;
  CatalogLookupBehavior lookup_behavior;
  string *in_stack_00000130;
  CatalogEntryLookup *in_stack_00000138;
  CatalogEntryLookup *in_stack_00000140;
  optional_ptr<duckdb::Catalog,_true> catalog_entry;
  CatalogSearchEntry *entry;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::CatalogSearchEntry,_true> *__range1;
  vector<duckdb::CatalogLookup,_true> final_lookups;
  vector<duckdb::CatalogLookup,_true> lookups;
  vector<duckdb::CatalogSearchEntry,_true> entries;
  CatalogEntryLookup *lookup_result_default_table;
  CatalogEntryLookup *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  CatalogLookup *in_stack_fffffffffffffe18;
  undefined5 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe25;
  undefined1 in_stack_fffffffffffffe26;
  undefined1 in_stack_fffffffffffffe27;
  Catalog *in_stack_fffffffffffffe28;
  Catalog *in_stack_fffffffffffffe30;
  undefined6 in_stack_fffffffffffffe38;
  char in_stack_fffffffffffffe3e;
  CatalogType in_stack_fffffffffffffe3f;
  vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_> *in_stack_fffffffffffffe40;
  string *catalog_name;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  byte bVar5;
  OnEntryNotFound in_stack_fffffffffffffecf;
  EntryLookupInfo *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  CatalogEntryRetriever *in_stack_fffffffffffffee8;
  __normal_iterator<duckdb::CatalogLookup_*,_std::vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>_>
  local_d8;
  undefined1 *local_d0;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  uint uVar6;
  optional_ptr<duckdb::Catalog,_true> in_stack_ffffffffffffff40;
  CatalogEntryRetriever *in_stack_ffffffffffffff48;
  optional_ptr<duckdb::Catalog,_true> local_b0;
  reference local_a8;
  CatalogSearchEntry *local_a0;
  __normal_iterator<duckdb::CatalogSearchEntry_*,_std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>_>
  local_98;
  undefined1 *local_90;
  undefined1 local_78 [24];
  undefined1 local_60 [55];
  char local_29;
  EntryLookupInfo *local_28;
  
  local_29 = in_R9B;
  local_28 = in_R8;
  GetCatalogEntries(in_stack_ffffffffffffff48,(string *)in_stack_ffffffffffffff40.ptr,
                    (string *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  catalog_name = (string *)local_60;
  vector<duckdb::CatalogLookup,_true>::vector((vector<duckdb::CatalogLookup,_true> *)0x2a0012);
  vector<duckdb::CatalogLookup,_true>::vector((vector<duckdb::CatalogLookup,_true> *)0x2a001f);
  ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::size
            ((vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> *)
             (local_60 + 0x18));
  ::std::vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>::reserve
            (in_stack_fffffffffffffe40,
             CONCAT17(in_stack_fffffffffffffe3f,
                      CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)));
  local_90 = local_60 + 0x18;
  local_98._M_current =
       (CatalogSearchEntry *)
       ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::begin
                 ((vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> *
                  )in_stack_fffffffffffffe08);
  local_a0 = (CatalogSearchEntry *)
             ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
             ::end((vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
                    *)in_stack_fffffffffffffe08);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<duckdb::CatalogSearchEntry_*,_std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                            (__normal_iterator<duckdb::CatalogSearchEntry_*,_std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>_>
                             *)in_stack_fffffffffffffe08), bVar1) {
    local_a8 = __gnu_cxx::
               __normal_iterator<duckdb::CatalogSearchEntry_*,_std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>_>
               ::operator*(&local_98);
    optional_ptr<duckdb::Catalog,_true>::optional_ptr(&local_b0);
    if (local_29 == '\x01') {
      local_b0 = GetCatalogEntry((CatalogEntryRetriever *)
                                 CONCAT17(in_stack_fffffffffffffe3f,
                                          CONCAT16(in_stack_fffffffffffffe3e,
                                                   in_stack_fffffffffffffe38)),
                                 in_stack_fffffffffffffe30);
    }
    else {
      pCVar4 = GetCatalog((CatalogEntryRetriever *)
                          CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),catalog_name
                         );
      optional_ptr<duckdb::Catalog,_true>::optional_ptr
                ((optional_ptr<duckdb::Catalog,_true> *)&stack0xffffffffffffff40,pCVar4);
      local_b0.ptr = in_stack_ffffffffffffff40.ptr;
    }
    bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_b0);
    if (!bVar1) {
      optional_ptr<duckdb::SchemaCatalogEntry,_true>::optional_ptr
                (&in_RDI->schema,(SchemaCatalogEntry *)0x0);
      optional_ptr<duckdb::CatalogEntry,_true>::optional_ptr(&in_RDI->entry,(CatalogEntry *)0x0);
      ErrorData::ErrorData
                ((ErrorData *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
      goto LAB_002a04f6;
    }
    pCVar4 = optional_ptr<duckdb::Catalog,_true>::operator->
                       ((optional_ptr<duckdb::Catalog,_true> *)
                        CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
    in_stack_fffffffffffffe3f = EntryLookupInfo::GetCatalogType(local_28);
    iVar3 = (*pCVar4->_vptr_Catalog[0x18])(pCVar4,(ulong)in_stack_fffffffffffffe3f);
    in_stack_fffffffffffffe3e = (char)iVar3;
    if (in_stack_fffffffffffffe3e == '\0') {
      in_stack_fffffffffffffe30 =
           optional_ptr<duckdb::Catalog,_true>::operator*
                     ((optional_ptr<duckdb::Catalog,_true> *)
                      CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
      ::std::vector<duckdb::CatalogLookup,std::allocator<duckdb::CatalogLookup>>::
      emplace_back<duckdb::Catalog&,std::__cxx11::string&,duckdb::EntryLookupInfo_const&>
                ((vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_> *)
                 in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe27,
                          CONCAT16(in_stack_fffffffffffffe26,
                                   CONCAT15(in_stack_fffffffffffffe25,in_stack_fffffffffffffe20))),
                 (EntryLookupInfo *)in_stack_fffffffffffffe18);
    }
    else if (in_stack_fffffffffffffe3e == '\x01') {
      in_stack_fffffffffffffe28 =
           optional_ptr<duckdb::Catalog,_true>::operator*
                     ((optional_ptr<duckdb::Catalog,_true> *)
                      CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
      ::std::vector<duckdb::CatalogLookup,std::allocator<duckdb::CatalogLookup>>::
      emplace_back<duckdb::Catalog&,std::__cxx11::string&,duckdb::EntryLookupInfo_const&>
                ((vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_> *)
                 in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe27,
                          CONCAT16(in_stack_fffffffffffffe26,
                                   CONCAT15(in_stack_fffffffffffffe25,in_stack_fffffffffffffe20))),
                 (EntryLookupInfo *)in_stack_fffffffffffffe18);
    }
    __gnu_cxx::
    __normal_iterator<duckdb::CatalogSearchEntry_*,_std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>_>
    ::operator++(&local_98);
  }
  local_d0 = local_78;
  local_d8._M_current =
       (CatalogLookup *)
       ::std::vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>::begin
                 ((vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_> *)
                  in_stack_fffffffffffffe08);
  ::std::vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>::end
            ((vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_> *)
             in_stack_fffffffffffffe08);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<duckdb::CatalogLookup_*,_std::vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                            (__normal_iterator<duckdb::CatalogLookup_*,_std::vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>_>
                             *)in_stack_fffffffffffffe08), bVar1) {
    __gnu_cxx::
    __normal_iterator<duckdb::CatalogLookup_*,_std::vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>_>
    ::operator*(&local_d8);
    ::std::vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>::
    emplace_back<duckdb::CatalogLookup>
              ((vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_> *)
               CONCAT17(in_stack_fffffffffffffe27,
                        CONCAT16(in_stack_fffffffffffffe26,
                                 CONCAT15(in_stack_fffffffffffffe25,in_stack_fffffffffffffe20))),
               in_stack_fffffffffffffe18);
    __gnu_cxx::
    __normal_iterator<duckdb::CatalogLookup_*,_std::vector<duckdb::CatalogLookup,_std::allocator<duckdb::CatalogLookup>_>_>
    ::operator++(&local_d8);
  }
  TryLookupEntry((CatalogEntryRetriever *)lookup_result.error.extra_info._M_h._M_before_begin._M_nxt
                 ,(vector<duckdb::CatalogLookup,_true> *)
                  lookup_result.error.extra_info._M_h._M_bucket_count,
                 (EntryLookupInfo *)lookup_result.error.extra_info._M_h._M_buckets,
                 lookup_result.error.final_message.field_2._M_local_buf[0xf]);
  CVar2 = EntryLookupInfo::GetCatalogType(local_28);
  if (CVar2 == TABLE_ENTRY) {
    bVar5 = 0;
    TryLookupDefaultTable
              (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
               in_stack_fffffffffffffed0,in_stack_fffffffffffffecf);
    bVar1 = CatalogEntryLookup::Found((CatalogEntryLookup *)0x2a03c9);
    if ((bVar1) && (bVar1 = CatalogEntryLookup::Found((CatalogEntryLookup *)0x2a03e9), bVar1)) {
      EntryLookupInfo::GetEntryName_abi_cxx11_(local_28);
      ThrowDefaultTableAmbiguityException(in_stack_00000140,in_stack_00000138,in_stack_00000130);
    }
    in_stack_fffffffffffffe17 = CatalogEntryLookup::Found((CatalogEntryLookup *)0x2a046e);
    if ((bool)in_stack_fffffffffffffe17) {
      bVar5 = 1;
    }
    uVar6 = (uint)(byte)in_stack_fffffffffffffe17;
    if ((bVar5 & 1) == 0) {
      CatalogEntryLookup::~CatalogEntryLookup((CatalogEntryLookup *)0x2a04ac);
    }
    if (uVar6 != 0) goto LAB_002a04d8;
  }
  CatalogEntryLookup::CatalogEntryLookup
            ((CatalogEntryLookup *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
             in_stack_fffffffffffffe08);
LAB_002a04d8:
  CatalogEntryLookup::~CatalogEntryLookup((CatalogEntryLookup *)0x2a04e5);
LAB_002a04f6:
  vector<duckdb::CatalogLookup,_true>::~vector((vector<duckdb::CatalogLookup,_true> *)0x2a0503);
  vector<duckdb::CatalogLookup,_true>::~vector((vector<duckdb::CatalogLookup,_true> *)0x2a0510);
  vector<duckdb::CatalogSearchEntry,_true>::~vector
            ((vector<duckdb::CatalogSearchEntry,_true> *)0x2a051d);
  return in_RDI;
}

Assistant:

CatalogEntryLookup Catalog::TryLookupEntry(CatalogEntryRetriever &retriever, const string &catalog,
                                           const string &schema, const EntryLookupInfo &lookup_info,
                                           OnEntryNotFound if_not_found) {
	auto entries = GetCatalogEntries(retriever, catalog, schema);
	vector<CatalogLookup> lookups;
	vector<CatalogLookup> final_lookups;
	lookups.reserve(entries.size());
	for (auto &entry : entries) {
		optional_ptr<Catalog> catalog_entry;
		if (if_not_found == OnEntryNotFound::RETURN_NULL) {
			catalog_entry = Catalog::GetCatalogEntry(retriever, entry.catalog);
		} else {
			catalog_entry = &Catalog::GetCatalog(retriever, entry.catalog);
		}
		if (!catalog_entry) {
			return {nullptr, nullptr, ErrorData()};
		}
		D_ASSERT(catalog_entry);
		auto lookup_behavior = catalog_entry->CatalogTypeLookupRule(lookup_info.GetCatalogType());
		if (lookup_behavior == CatalogLookupBehavior::STANDARD) {
			lookups.emplace_back(*catalog_entry, entry.schema, lookup_info);
		} else if (lookup_behavior == CatalogLookupBehavior::LOWER_PRIORITY) {
			final_lookups.emplace_back(*catalog_entry, entry.schema, lookup_info);
		}
	}

	for (auto &lookup : final_lookups) {
		lookups.emplace_back(std::move(lookup));
	}

	// Do the main lookup
	auto lookup_result = TryLookupEntry(retriever, lookups, lookup_info, if_not_found);

	// Special case for tables: we do a second lookup searching for catalogs with default tables that also match this
	// lookup
	if (lookup_info.GetCatalogType() == CatalogType::TABLE_ENTRY) {
		auto lookup_result_default_table =
		    TryLookupDefaultTable(retriever, catalog, schema, lookup_info, OnEntryNotFound::RETURN_NULL);

		if (lookup_result_default_table.Found() && lookup_result.Found()) {
			ThrowDefaultTableAmbiguityException(lookup_result, lookup_result_default_table, lookup_info.GetEntryName());
		}

		if (lookup_result_default_table.Found()) {
			return lookup_result_default_table;
		}
	}

	return lookup_result;
}